

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interp-inl.h
# Opt level: O1

Result __thiscall
wabt::interp::Memory::AtomicRmw<unsigned_short,unsigned_short(*&)(unsigned_short,unsigned_short)>
          (Memory *this,u64 offset,u64 addend,unsigned_short rhs,
          BinopFunc<unsigned_short,_unsigned_short> **func,unsigned_short *out)

{
  pointer puVar1;
  bool bVar2;
  unsigned_short uVar3;
  unsigned_short uVar4;
  ulong uVar5;
  Enum EVar6;
  byte bVar7;
  ulong uVar8;
  
  puVar1 = (this->data_).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
           super__Vector_impl_data._M_start;
  uVar8 = (long)(this->data_).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                _M_impl.super__Vector_impl_data._M_finish - (long)puVar1;
  uVar4 = 0;
  if (((1 < uVar8) && (offset <= uVar8)) && (addend <= uVar8)) {
    uVar5 = addend + offset + 2;
    uVar4 = (unsigned_short)CONCAT71((int7)(uVar5 >> 8),uVar5 <= uVar8);
  }
  uVar8 = addend + offset;
  bVar7 = (uVar8 & 1) == 0 & (byte)uVar4;
  if (bVar7 == 1) {
    uVar4 = *(unsigned_short *)(puVar1 + uVar8);
  }
  EVar6 = Error;
  if (bVar7 != 0) {
    uVar3 = (**func)(uVar4,rhs);
    puVar1 = (this->data_).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
             .super__Vector_impl_data._M_start;
    uVar5 = (long)(this->data_).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                  _M_impl.super__Vector_impl_data._M_finish - (long)puVar1;
    bVar2 = false;
    if (((1 < uVar5) && (bVar2 = false, offset <= uVar5)) && (addend <= uVar5)) {
      bVar2 = uVar8 + 2 <= uVar5;
    }
    if (((uVar8 & 1) == 0) && (bVar2)) {
      *(unsigned_short *)(puVar1 + uVar8) = uVar3;
      *out = uVar4;
      EVar6 = Ok;
    }
  }
  return (Result)EVar6;
}

Assistant:

Result Memory::AtomicRmw(u64 offset, u64 addend, T rhs, F&& func, T* out) {
  T lhs;
  CHECK_RESULT(AtomicLoad(offset, addend, &lhs));
  CHECK_RESULT(AtomicStore(offset, addend, func(lhs, rhs)));
  *out = lhs;
  return Result::Ok;
}